

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrUtils-CPConv_IConv.c
# Opt level: O0

UINT8 CPConv_StrConvert(CPCONV *cpc,size_t *outSize,char **outStr,size_t inSize,char *inStr)

{
  int iVar1;
  long lVar2;
  size_t sVar3;
  void *pvVar4;
  int *piVar5;
  long lVar6;
  size_t sStack_78;
  int err;
  char *outPtrPrev;
  UINT8 canRealloc;
  size_t sStack_68;
  char resVal;
  size_t wrtBytes;
  char *outPtr;
  char *inPtr;
  size_t remBytesOut;
  size_t remBytesIn;
  size_t outBufSize;
  char *inStr_local;
  size_t inSize_local;
  char **outStr_local;
  size_t *outSize_local;
  CPCONV *cpc_local;
  
  outBufSize = (size_t)inStr;
  inStr_local = (char *)inSize;
  inSize_local = (size_t)outStr;
  outStr_local = (char **)outSize;
  outSize_local = (size_t *)cpc;
  iconv(cpc->hIConv,(char **)0x0,(size_t *)0x0,(char **)0x0,(size_t *)0x0);
  if (inStr_local == (char *)0x0) {
    sVar3 = GetStrSize((char *)outBufSize,outSize_local[3]);
    inStr_local = (char *)(sVar3 + outSize_local[3]);
  }
  remBytesOut = (size_t)inStr_local;
  outPtr = (char *)outBufSize;
  if (inStr_local == (char *)0x0) {
    *outStr_local = (char *)0x0;
    cpc_local._7_1_ = '\0';
  }
  else {
    lVar2 = *(long *)inSize_local;
    if (lVar2 != 0) {
      remBytesIn = (size_t)*outStr_local;
    }
    else {
      remBytesIn = ((long)inStr_local * outSize_local[4] * 3 >> 1) / outSize_local[3];
      pvVar4 = malloc(remBytesIn);
      *(void **)inSize_local = pvVar4;
    }
    inPtr = (char *)remBytesIn;
    wrtBytes = *(size_t *)inSize_local;
    outPtrPrev._7_1_ = '\0';
    sStack_78 = 0;
    sStack_68 = iconv((iconv_t)outSize_local[2],&outPtr,&remBytesOut,(char **)&wrtBytes,
                      (size_t *)&inPtr);
    while (sStack_68 == 0xffffffffffffffff) {
      piVar5 = __errno_location();
      iVar1 = *piVar5;
      if ((iVar1 == 0x54) || (iVar1 == 0x16)) {
        outPtrPrev._7_1_ = 0x80;
        if ((iVar1 == 0x16) && (remBytesOut < 2)) {
          iconv((iconv_t)outSize_local[2],(char **)0x0,(size_t *)0x0,(char **)&wrtBytes,
                (size_t *)&inPtr);
          outPtrPrev._7_1_ = '\x01';
        }
        break;
      }
      if (lVar2 != 0) {
        outPtrPrev._7_1_ = '\x10';
        break;
      }
      if (sStack_78 == wrtBytes) {
        outPtrPrev._7_1_ = 0xf0;
        break;
      }
      lVar6 = wrtBytes - *(long *)inSize_local;
      remBytesIn = remBytesOut * 2 + remBytesIn;
      pvVar4 = realloc(*(void **)inSize_local,remBytesIn);
      *(void **)inSize_local = pvVar4;
      sStack_78 = *(long *)inSize_local + lVar6;
      inPtr = (char *)(remBytesIn - lVar6);
      wrtBytes = sStack_78;
      sStack_68 = iconv((iconv_t)outSize_local[2],&outPtr,&remBytesOut,(char **)&wrtBytes,
                        (size_t *)&inPtr);
    }
    *outStr_local = (char *)(wrtBytes - *(long *)inSize_local);
    cpc_local._7_1_ = outPtrPrev._7_1_;
  }
  return cpc_local._7_1_;
}

Assistant:

UINT8 CPConv_StrConvert(CPCONV* cpc, size_t* outSize, char** outStr, size_t inSize, const char* inStr)
{
	size_t outBufSize;
	size_t remBytesIn;
	size_t remBytesOut;
	char* inPtr;
	char* outPtr;
	size_t wrtBytes;
	char resVal;
	UINT8 canRealloc;
	char* outPtrPrev;
	
	iconv(cpc->hIConv, NULL, NULL, NULL, NULL);	// reset conversion state
	
	if (! inSize)
		inSize = GetStrSize(inStr, cpc->cpfCharSize) + cpc->cpfCharSize;	// include \0 terminator
	remBytesIn = inSize;
	inPtr = (char*)&inStr[0];	// const-cast due to a bug in the iconv API
	if (remBytesIn == 0)
	{
		*outSize = 0;
		return 0x00;	// nothing to convert
	}
	
	if (*outStr == NULL)
	{
		outBufSize = remBytesIn * cpc->cptCharSize * 3 / 2 / cpc->cpfCharSize;
		*outStr = (char*)malloc(outBufSize);
		canRealloc = 1;
	}
	else
	{
		outBufSize = *outSize;
		canRealloc = 0;
	}
	remBytesOut = outBufSize;
	outPtr = *outStr;
	
	resVal = 0x00;	// default: conversion successfull
	outPtrPrev = NULL;
	wrtBytes = iconv(cpc->hIConv, &inPtr, &remBytesIn, &outPtr, &remBytesOut);
	while(wrtBytes == (size_t)-1)
	{
		int err = errno;
		if (err == EILSEQ || err == EINVAL)
		{
			// invalid encoding
			resVal = 0x80;
			if (err == EINVAL && remBytesIn <= 1)
			{
				// assume that the string got truncated
				iconv(cpc->hIConv, NULL, NULL, &outPtr, &remBytesOut);
				resVal = 0x01;	// conversion incomplete due to input error
			}
			break;
		}
		// err == E2BIG
		if (! canRealloc)
		{
			resVal = 0x10;	// conversion incomplete due to lack of buffer space
			break;
		}
		if (outPtrPrev == outPtr)
		{
			resVal = 0xF0;	// unexpected conversion error
			break;
		}
		wrtBytes = outPtr - *outStr;
		outBufSize += remBytesIn * 2;
		*outStr = (char*)realloc(*outStr, outBufSize);
		outPtr = *outStr + wrtBytes;
		remBytesOut = outBufSize - wrtBytes;
		
		outPtrPrev = outPtr;
		wrtBytes = iconv(cpc->hIConv, &inPtr, &remBytesIn, &outPtr, &remBytesOut);
	}
	
	*outSize = outPtr - *outStr;
	return resVal;
}